

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  long *plVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_8;
  
  plVar2 = (long *)handle->data;
  piVar1 = (int *)((long)plVar2 + 0x114);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if ((test_mode == '\x01') && ((int)plVar2[0x22] == 0)) {
    local_8 = plVar2[0x20];
    if (local_8 != 0) {
      connection_close_cb_cold_2();
      goto LAB_001b6af8;
    }
  }
  else {
    local_8 = plVar2[0x20];
    if (local_8 != 0x10000) {
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  if ((test_mode != '\0') && ((int)plVar2[0x22] != 0)) {
    local_8 = plVar2[0x21];
    if (local_8 == 0) goto LAB_001b6ab5;
    plVar2 = &local_8;
    connection_close_cb_cold_3();
  }
  local_8 = plVar2[0x21];
  if (local_8 != 0x10000) {
LAB_001b6b07:
    plVar2 = &local_8;
    connection_close_cb_cold_4();
    free((void *)*plVar2);
    return;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(plVar2);
  return;
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT_EQ(context->read, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->read);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT_EQ(context->sent, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->sent);
    }

    closed_connections++;

    free(context);
  }
}